

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_horiz_rs_sse4.c
# Opt level: O0

void av1_convolve_horiz_rs_sse4_1
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               int16_t *x_filters,int x0_qn,int x_step_qn)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int in_ECX;
  long in_RDX;
  int in_ESI;
  ulong uVar6;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i alVar11;
  __m128i shifted_8;
  __m128i shifted_16;
  __m128i shifted_32;
  __m128i conv0123_32;
  __m128i conv23_32;
  __m128i conv01_32;
  __m128i conv3_32;
  __m128i conv2_32;
  __m128i conv1_32;
  __m128i conv0_32;
  __m128i src3_16;
  __m128i src2_16;
  __m128i src1_16;
  __m128i src0_16;
  __m128i src3_8;
  __m128i src2_8;
  __m128i src1_8;
  __m128i src0_8;
  uint8_t *src_x3;
  uint8_t *src_x2;
  uint8_t *src_x1;
  uint8_t *src_x0;
  int y;
  __m128i fil3_16;
  __m128i fil2_16;
  __m128i fil1_16;
  __m128i fil0_16;
  int16_t *x_filter3;
  int16_t *x_filter2;
  int16_t *x_filter1;
  int16_t *x_filter0;
  int x_filter_idx3;
  int x_filter_idx2;
  int x_filter_idx1;
  int x_filter_idx0;
  int x;
  int x_qn;
  uint8_t *dst_y;
  uint8_t *src_y;
  __m128i zero;
  __m128i round_add;
  undefined4 local_2bc;
  undefined4 local_240;
  undefined4 local_23c;
  undefined8 local_238;
  undefined8 local_230;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  
  local_23c = (uint)shifted_16[0];
  for (local_240 = 0; local_240 < in_R8D; local_240 = local_240 + 4) {
    xx_loadu_128((void *)(shifted_8[1] + (long)(((int)(local_23c & 0x3fff) >> 8) << 3) * 2));
    xx_loadu_128((void *)(shifted_8[1] +
                         (long)(((int)(local_23c + (uint)shifted_16[1] & 0x3fff) >> 8) << 3) * 2));
    xx_loadu_128((void *)(shifted_8[1] +
                         (long)(((int)(local_23c + (uint)shifted_16[1] * 2 & 0x3fff) >> 8) << 3) * 2
                         ));
    xx_loadu_128((void *)(shifted_8[1] +
                         (long)(((int)(local_23c + (uint)shifted_16[1] * 3 & 0x3fff) >> 8) << 3) * 2
                         ));
    local_238 = in_RDX;
    local_230 = in_RDI + -3;
    for (local_2bc = 0; local_2bc < in_R9D; local_2bc = local_2bc + 1) {
      uVar6 = (ulong)(uint)shifted_16[1];
      xx_loadl_64((void *)(local_230 + ((int)local_23c >> 0xe)));
      xx_loadl_64((void *)(local_230 + ((int)(local_23c + (uint)shifted_16[1]) >> 0xe)));
      xx_loadl_64((void *)(local_230 + ((int)(local_23c + (uint)shifted_16[1] * 2) >> 0xe)));
      alVar11 = xx_loadl_64((void *)(local_230 + ((int)(local_23c + (uint)shifted_16[1] * 3) >> 0xe)
                                    ));
      auVar7._8_8_ = extraout_XMM0_Qb_03;
      auVar7._0_8_ = extraout_XMM0_Qa_03;
      auVar7 = pmovzxbw(auVar7,extraout_XMM0_Qa_03);
      auVar8._8_8_ = extraout_XMM0_Qb_04;
      auVar8._0_8_ = extraout_XMM0_Qa_04;
      auVar8 = pmovzxbw(auVar8,extraout_XMM0_Qa_04);
      auVar9._8_8_ = extraout_XMM0_Qb_05;
      auVar9._0_8_ = extraout_XMM0_Qa_05;
      auVar9 = pmovzxbw(auVar9,extraout_XMM0_Qa_05);
      auVar10._8_8_ = extraout_XMM0_Qb_06;
      auVar10._0_8_ = extraout_XMM0_Qa_06;
      auVar10 = pmovzxbw(auVar10,extraout_XMM0_Qa_06);
      auVar4._8_8_ = extraout_XMM0_Qb;
      auVar4._0_8_ = extraout_XMM0_Qa;
      auVar7 = pmaddwd(auVar7,auVar4);
      auVar3._8_8_ = extraout_XMM0_Qb_00;
      auVar3._0_8_ = extraout_XMM0_Qa_00;
      auVar8 = pmaddwd(auVar8,auVar3);
      auVar2._8_8_ = extraout_XMM0_Qb_01;
      auVar2._0_8_ = extraout_XMM0_Qa_01;
      auVar9 = pmaddwd(auVar9,auVar2);
      auVar1._8_8_ = extraout_XMM0_Qb_02;
      auVar1._0_8_ = extraout_XMM0_Qa_02;
      auVar10 = pmaddwd(auVar10,auVar1);
      auVar8 = phaddd(auVar7,auVar8);
      auVar10 = phaddd(auVar9,auVar10);
      auVar10 = phaddd(auVar8,auVar10);
      local_78 = auVar10._0_4_;
      uStack_74 = auVar10._4_4_;
      uStack_70 = auVar10._8_4_;
      uStack_6c = auVar10._12_4_;
      auVar10 = ZEXT416(7);
      auVar5._4_4_ = uStack_74 + 0x40 >> auVar10;
      auVar5._0_4_ = local_78 + 0x40 >> auVar10;
      auVar5._12_4_ = uStack_6c + 0x40 >> auVar10;
      auVar5._8_4_ = uStack_70 + 0x40 >> auVar10;
      packusdw(auVar5,ZEXT816(0));
      alVar11[0] = uVar6;
      xx_storel_32((void *)(local_238 + local_240),alVar11);
      local_230 = local_230 + in_ESI;
      local_238 = local_238 + in_ECX;
    }
    local_23c = (uint)shifted_16[1] * 4 + local_23c;
  }
  return;
}

Assistant:

void av1_convolve_horiz_rs_sse4_1(const uint8_t *src, int src_stride,
                                  uint8_t *dst, int dst_stride, int w, int h,
                                  const int16_t *x_filters, int x0_qn,
                                  int x_step_qn) {
  assert(UPSCALE_NORMATIVE_TAPS == 8);

  src -= UPSCALE_NORMATIVE_TAPS / 2 - 1;

  const __m128i round_add = _mm_set1_epi32((1 << FILTER_BITS) >> 1);
  const __m128i zero = _mm_setzero_si128();

  const uint8_t *src_y;
  uint8_t *dst_y;
  int x_qn = x0_qn;
  for (int x = 0; x < w; x += 4, x_qn += 4 * x_step_qn) {
    const int x_filter_idx0 =
        ((x_qn + 0 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
    const int x_filter_idx1 =
        ((x_qn + 1 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
    const int x_filter_idx2 =
        ((x_qn + 2 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
    const int x_filter_idx3 =
        ((x_qn + 3 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;

    assert(x_filter_idx0 <= RS_SUBPEL_MASK);
    assert(x_filter_idx1 <= RS_SUBPEL_MASK);
    assert(x_filter_idx2 <= RS_SUBPEL_MASK);
    assert(x_filter_idx3 <= RS_SUBPEL_MASK);

    const int16_t *const x_filter0 =
        &x_filters[x_filter_idx0 * UPSCALE_NORMATIVE_TAPS];
    const int16_t *const x_filter1 =
        &x_filters[x_filter_idx1 * UPSCALE_NORMATIVE_TAPS];
    const int16_t *const x_filter2 =
        &x_filters[x_filter_idx2 * UPSCALE_NORMATIVE_TAPS];
    const int16_t *const x_filter3 =
        &x_filters[x_filter_idx3 * UPSCALE_NORMATIVE_TAPS];

    const __m128i fil0_16 = xx_loadu_128(x_filter0);
    const __m128i fil1_16 = xx_loadu_128(x_filter1);
    const __m128i fil2_16 = xx_loadu_128(x_filter2);
    const __m128i fil3_16 = xx_loadu_128(x_filter3);

    src_y = src;
    dst_y = dst;
    for (int y = 0; y < h; y++, src_y += src_stride, dst_y += dst_stride) {
      const uint8_t *const src_x0 =
          &src_y[(x_qn + 0 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];
      const uint8_t *const src_x1 =
          &src_y[(x_qn + 1 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];
      const uint8_t *const src_x2 =
          &src_y[(x_qn + 2 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];
      const uint8_t *const src_x3 =
          &src_y[(x_qn + 3 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];

      // Load up the source data. This is 8-bit input data, so each load
      // gets 8 pixels.
      const __m128i src0_8 = xx_loadl_64(src_x0);
      const __m128i src1_8 = xx_loadl_64(src_x1);
      const __m128i src2_8 = xx_loadl_64(src_x2);
      const __m128i src3_8 = xx_loadl_64(src_x3);

      // Now zero-extend up to 16-bit precision, i.e.
      // [ 00 00 00 00 hg fe dc ba ] -> [ 0h 0g 0f 0e 0d 0c 0b 0a ]
      const __m128i src0_16 = _mm_cvtepu8_epi16(src0_8);
      const __m128i src1_16 = _mm_cvtepu8_epi16(src1_8);
      const __m128i src2_16 = _mm_cvtepu8_epi16(src2_8);
      const __m128i src3_16 = _mm_cvtepu8_epi16(src3_8);

      // Multiply by filter coefficients (results in a 32-bit value),
      // and add adjacent pairs, i.e.
      // ([ s7 s6 s5 s4 s3 s2 s1 s0], [ f7 f6 f5 f4 f3 f2 f1 f0 ])
      // -> [ {s7*f7+s6*f6} {s5*f5+s4*f4} {s3*f3+s2*f2} {s1*f1+s0*f0} ]
      const __m128i conv0_32 = _mm_madd_epi16(src0_16, fil0_16);
      const __m128i conv1_32 = _mm_madd_epi16(src1_16, fil1_16);
      const __m128i conv2_32 = _mm_madd_epi16(src2_16, fil2_16);
      const __m128i conv3_32 = _mm_madd_epi16(src3_16, fil3_16);

      // Reduce horizontally and add, i.e.
      // ([ D C B A ], [ S R Q P ]) -> [ S+R Q+P D+C B+A ]
      const __m128i conv01_32 = _mm_hadd_epi32(conv0_32, conv1_32);
      const __m128i conv23_32 = _mm_hadd_epi32(conv2_32, conv3_32);

      const __m128i conv0123_32 = _mm_hadd_epi32(conv01_32, conv23_32);

      // Divide down by (1 << FILTER_BITS), rounding to nearest.
      const __m128i shifted_32 =
          _mm_srai_epi32(_mm_add_epi32(conv0123_32, round_add), FILTER_BITS);

      // Pack 32-bit values into 16-bit values, i.e.
      // ([ D C B A ], [ 0 0 0 0 ]) -> [ 0 0 0 0 D C B A ]
      const __m128i shifted_16 = _mm_packus_epi32(shifted_32, zero);

      // Pack 16-bit values into 8-bit values, i.e.
      // ([ 0 0 0 0 D C B A ], [ 0 0 0 0 0 0 0 0 ])
      // -> [ 0 0 0 0 0 0 DC BA ]
      const __m128i shifted_8 = _mm_packus_epi16(shifted_16, zero);

      // Write to the output
      xx_storel_32(&dst_y[x], shifted_8);
    }
  }
}